

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *os)

{
  byte bVar1;
  char cVar2;
  byte *pbVar3;
  char *pcVar4;
  Ch *pCVar5;
  bool bVar6;
  uint codepoint;
  uint uVar7;
  size_t escapeOffset;
  
  do {
    while( true ) {
      while( true ) {
        pbVar3 = (byte *)is->src_;
        bVar1 = *pbVar3;
        if (bVar1 == 0x5c) break;
        if (bVar1 == 0x22) {
          is->src_ = (Ch *)(pbVar3 + 1);
          pCVar5 = os->dst_;
          if (pCVar5 != (Ch *)0x0) {
            os->dst_ = pCVar5 + 1;
            *pCVar5 = '\0';
            return;
          }
          goto LAB_0011b56c;
        }
        if (bVar1 < 0x20) {
          ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                    ();
          return;
        }
        bVar6 = Transcoder<rapidjson::UTF8<char>,rapidjson::UTF8<char>>::
                Transcode<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                          (is,os);
        if (!bVar6) {
          ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                    ();
          return;
        }
      }
      escapeOffset = (long)pbVar3 - (long)is->head_;
      is->src_ = (Ch *)(pbVar3 + 1);
      cVar2 = ""[pbVar3[1]];
      if (cVar2 == '\0') break;
      is->src_ = (Ch *)(pbVar3 + 2);
      pcVar4 = os->dst_;
      if (pcVar4 == (char *)0x0) {
LAB_0011b56c:
        __assert_fail("dst_ != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/stream.h"
                      ,199,
                      "void rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>::Put(Ch) [Encoding = rapidjson::UTF8<>]"
                     );
      }
      os->dst_ = pcVar4 + 1;
      *pcVar4 = cVar2;
    }
    if (pbVar3[1] != 0x75) {
      ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                ();
      return;
    }
    is->src_ = (Ch *)(pbVar3 + 2);
    codepoint = ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                          (this,is,escapeOffset);
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if ((codepoint & 0xfffffc00) == 0xd800) {
      pcVar4 = is->src_;
      if ((*pcVar4 != '\\') || (is->src_ = pcVar4 + 1, pcVar4[1] != 'u')) {
        *(undefined4 *)(this + 0x30) = 9;
        *(size_t *)(this + 0x38) = escapeOffset;
        return;
      }
      is->src_ = pcVar4 + 2;
      uVar7 = ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                        (this,is,escapeOffset);
      if (*(int *)(this + 0x30) == 0) {
        if (uVar7 - 0xe000 < 0xfffffc00) {
          *(undefined4 *)(this + 0x30) = 9;
          *(size_t *)(this + 0x38) = escapeOffset;
          goto LAB_0011b51c;
        }
        codepoint = codepoint * 0x400 + uVar7 + 0xfca02400;
        bVar6 = true;
      }
      else {
LAB_0011b51c:
        bVar6 = false;
      }
      if (!bVar6) {
        return;
      }
    }
    UTF8<char>::Encode<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(os,codepoint);
  } while( true );
}

Assistant:

RAPIDJSON_FORCEINLINE void ParseStringToStream(InputStream& is, OutputStream& os) {
//!@cond RAPIDJSON_HIDDEN_FROM_DOXYGEN
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
        static const char escape[256] = {
            Z16, Z16, 0, 0,'\"', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'/',
            Z16, Z16, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'\\', 0, 0, 0,
            0, 0,'\b', 0, 0, 0,'\f', 0, 0, 0, 0, 0, 0, 0,'\n', 0,
            0, 0,'\r', 0,'\t', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16
        };
#undef Z16
//!@endcond

        for (;;) {
            // Scan and copy string before "\\\"" or < 0x20. This is an optional optimzation.
            if (!(parseFlags & kParseValidateEncodingFlag))
                ScanCopyUnescapedString(is, os);

            Ch c = is.Peek();
            if (RAPIDJSON_UNLIKELY(c == '\\')) {    // Escape
                size_t escapeOffset = is.Tell();    // For invalid escaping, report the initial '\\' as error offset
                is.Take();
                Ch e = is.Peek();
                if ((sizeof(Ch) == 1 || unsigned(e) < 256) && RAPIDJSON_LIKELY(escape[static_cast<unsigned char>(e)])) {
                    is.Take();
                    os.Put(static_cast<typename TEncoding::Ch>(escape[static_cast<unsigned char>(e)]));
                }
                else if (RAPIDJSON_LIKELY(e == 'u')) {    // Unicode
                    is.Take();
                    unsigned codepoint = ParseHex4(is, escapeOffset);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    if (RAPIDJSON_UNLIKELY(codepoint >= 0xD800 && codepoint <= 0xDBFF)) {
                        // Handle UTF-16 surrogate pair
                        if (RAPIDJSON_UNLIKELY(!Consume(is, '\\') || !Consume(is, 'u')))
                            RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        unsigned codepoint2 = ParseHex4(is, escapeOffset);
                        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                        if (RAPIDJSON_UNLIKELY(codepoint2 < 0xDC00 || codepoint2 > 0xDFFF))
                            RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        codepoint = (((codepoint - 0xD800) << 10) | (codepoint2 - 0xDC00)) + 0x10000;
                    }
                    TEncoding::Encode(os, codepoint);
                }
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringEscapeInvalid, escapeOffset);
            }
            else if (RAPIDJSON_UNLIKELY(c == '"')) {    // Closing double quote
                is.Take();
                os.Put('\0');   // null-terminate the string
                return;
            }
            else if (RAPIDJSON_UNLIKELY(static_cast<unsigned>(c) < 0x20)) { // RFC 4627: unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
                if (c == '\0')
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringMissQuotationMark, is.Tell());
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, is.Tell());
            }
            else {
                size_t offset = is.Tell();
                if (RAPIDJSON_UNLIKELY((parseFlags & kParseValidateEncodingFlag ?
                    !Transcoder<SEncoding, TEncoding>::Validate(is, os) :
                    !Transcoder<SEncoding, TEncoding>::Transcode(is, os))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, offset);
            }
        }
    }